

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

bool Js::JavascriptOperators::AreSamePropertyDescriptors
               (PropertyDescriptor *x,PropertyDescriptor *y,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  Var pvVar5;
  Var pvVar6;
  void *aLeft;
  void *aRight;
  
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x269e,"(scriptContext)","scriptContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (x->configurableSpecified == y->configurableSpecified) {
    bVar2 = PropertyDescriptor::IsConfigurable(x);
    bVar3 = PropertyDescriptor::IsConfigurable(y);
    if (bVar2 != bVar3) {
      return false;
    }
    if (x->enumerableSpecified != y->enumerableSpecified) {
      return false;
    }
    bVar2 = PropertyDescriptor::IsEnumerable(x);
    bVar3 = PropertyDescriptor::IsEnumerable(y);
    if (bVar2 != bVar3) {
      return false;
    }
    if (x->valueSpecified == false && x->writableSpecified == false) {
      if (x->setterSpecified == false && x->getterSpecified == false) {
        return true;
      }
      if (y->setterSpecified == false && y->getterSpecified == false) {
        return false;
      }
      if (x->getterSpecified != false) {
        if (y->getterSpecified == false) {
          return false;
        }
        pvVar5 = PropertyDescriptor::GetGetter(x);
        pvVar5 = CanonicalizeAccessor(pvVar5,scriptContext);
        pvVar6 = PropertyDescriptor::GetGetter(y);
        pvVar6 = CanonicalizeAccessor(pvVar6,scriptContext);
        bVar2 = JavascriptConversion::SameValueCommon<false>(pvVar5,pvVar6);
        if (!bVar2) {
          return false;
        }
      }
      if (x->setterSpecified != true) {
        return true;
      }
      if (y->setterSpecified != true) {
        return false;
      }
      pvVar5 = PropertyDescriptor::GetSetter(x);
      aLeft = CanonicalizeAccessor(pvVar5,scriptContext);
      pvVar5 = PropertyDescriptor::GetSetter(y);
      aRight = CanonicalizeAccessor(pvVar5,scriptContext);
    }
    else {
      if (x->writableSpecified != y->writableSpecified) {
        return false;
      }
      if (y->writableSpecified == false && y->valueSpecified == false) {
        return false;
      }
      bVar2 = PropertyDescriptor::IsWritable(x);
      bVar3 = PropertyDescriptor::IsWritable(y);
      if (bVar2 != bVar3) {
        return false;
      }
      if (x->valueSpecified != true) {
        return true;
      }
      if (y->valueSpecified != true) {
        return false;
      }
      aLeft = (x->Value).ptr;
      aRight = (y->Value).ptr;
    }
    bVar2 = JavascriptConversion::SameValueCommon<false>(aLeft,aRight);
    if (bVar2) {
      return true;
    }
  }
  return false;
}

Assistant:

bool JavascriptOperators::AreSamePropertyDescriptors(const PropertyDescriptor* x, const PropertyDescriptor* y, ScriptContext* scriptContext)
    {
        Assert(scriptContext);

        if (x->ConfigurableSpecified() != y->ConfigurableSpecified() || x->IsConfigurable() != y->IsConfigurable() ||
            x->EnumerableSpecified() != y->EnumerableSpecified() || x->IsEnumerable() != y->IsEnumerable())
        {
            return false;
        }

        if (x->IsDataDescriptor())
        {
            if (!y->IsDataDescriptor() || x->WritableSpecified() != y->WritableSpecified() || x->IsWritable() != y->IsWritable())
            {
                return false;
            }

            if (x->ValueSpecified())
            {
                if (!y->ValueSpecified() || !JavascriptConversion::SameValue(x->GetValue(), y->GetValue()))
                {
                    return false;
                }
            }
        }
        else if (x->IsAccessorDescriptor())
        {
            if (!y->IsAccessorDescriptor())
            {
                return false;
            }

            if (x->GetterSpecified())
            {
                if (!y->GetterSpecified() || !JavascriptConversion::SameValue(
                    JavascriptOperators::CanonicalizeAccessor(x->GetGetter(), scriptContext),
                    JavascriptOperators::CanonicalizeAccessor(y->GetGetter(), scriptContext)))
                {
                    return false;
                }
            }

            if (x->SetterSpecified())
            {
                if (!y->SetterSpecified() || !JavascriptConversion::SameValue(
                    JavascriptOperators::CanonicalizeAccessor(x->GetSetter(), scriptContext),
                    JavascriptOperators::CanonicalizeAccessor(y->GetSetter(), scriptContext)))
                {
                    return false;
                }
            }
        }

        return true;
    }